

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

int __thiscall CTcSymFuncBase::write_to_sym_file(CTcSymFuncBase *this,CVmFile *fp)

{
  int iVar1;
  CTcSymFunc *pCVar2;
  uint uVar3;
  CTcSymFuncBase *in_RDI;
  int ext_modify;
  CTcSymFunc *cur;
  char buf [7];
  CVmFile *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffffd0;
  CTcSymFunc *local_28;
  undefined1 local_1f [2];
  undefined1 auStack_1d [2];
  undefined1 local_1b;
  undefined1 local_1a;
  byte local_19;
  int local_4;
  
  local_28 = get_mod_base(in_RDI);
  while( true ) {
    uVar5 = false;
    if (local_28 != (CTcSymFunc *)0x0) {
      pCVar2 = get_mod_base(&local_28->super_CTcSymFuncBase);
      uVar5 = pCVar2 != (CTcSymFunc *)0x0;
    }
    if ((bool)uVar5 == false) break;
    local_28 = get_mod_base(&local_28->super_CTcSymFuncBase);
  }
  uVar4 = false;
  if (local_28 != (CTcSymFunc *)0x0) {
    iVar1 = is_extern(&local_28->super_CTcSymFuncBase);
    uVar4 = iVar1 != 0;
  }
  uVar3 = (uint)(byte)uVar4;
  if ((((((byte)in_RDI->field_0x80 >> 2 & 1) == 0) && (((byte)in_RDI->field_0x80 >> 3 & 1) == 0)) &&
      (uVar3 == 0)) || (((byte)in_RDI->field_0x80 >> 6 & 1) != 0)) {
    CTcSymbolBase::write_to_sym_file
              ((CTcSymbolBase *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffffc0)),
               in_stack_ffffffffffffffb8);
    ::oswp2(local_1f,in_RDI->argc_);
    ::oswp2(auStack_1d,in_RDI->opt_argc_);
    local_1b = (in_RDI->field_0x80 & 1) != 0;
    local_1a = ((byte)in_RDI->field_0x80 >> 1 & 1) != 0;
    local_19 = 0;
    if (((byte)in_RDI->field_0x80 >> 5 & 1) != 0) {
      local_19 = 2;
    }
    local_19 = ((byte)in_RDI->field_0x80 >> 4 & 1) != 0 | local_19;
    CVmFile::write_bytes
              ((CVmFile *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),(char *)in_RDI,
               CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffffc0)));
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTcSymFuncBase::write_to_sym_file(CVmFile *fp)
{
    char buf[7];
    CTcSymFunc *cur;
    int ext_modify;

    /* scan for the bottom of our modify stack */
    for (cur = get_mod_base() ; cur != 0 && cur->get_mod_base() != 0 ;
         cur = cur->get_mod_base()) ;

    /* we modify an external if the bottom of our modify stack is external */
    ext_modify = (cur != 0 && cur->is_extern());

    /* 
     *   If we're external, don't bother writing to the file - if we're
     *   importing a function, we don't want to export it as well.  Note that
     *   a function that is replacing or modifying an external function is
     *   fundamentally external itself, because the function must be defined
     *   in another file to be replaceable/modifiable.
     *   
     *   As an exception, if this is a multi-method base symbol, and a
     *   multi-method with this name is defined in this file, export it even
     *   though it's technically an extern symbol.  We don't export most
     *   extern symbols because we count on the definer to export them, but
     *   in the case of multi-method base symbols, there is no definer - the
     *   base symbol is basically a placeholder to be filled in by the
     *   linker.  So *someone* has to export these.  The logical place to
     *   export them is from any file that defines a multi-method based on
     *   the base symbol.  
     */
    if ((is_extern_ || ext_replace_ || ext_modify) && !mm_def_)
        return FALSE;

    /* inherit default */
    CTcSymbol::write_to_sym_file(fp);

    /* write our argument count, varargs flag, and return value flag */
    oswp2(buf, argc_);
    oswp2(buf + 2, opt_argc_);
    buf[4] = (varargs_ != 0);
    buf[5] = (has_retval_ != 0);
    buf[6] = (is_multimethod_ ? 1 : 0)
             | (is_multimethod_base_ ? 2 : 0);
    fp->write_bytes(buf, 7);

    /* we wrote the symbol */
    return TRUE;
}